

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cc
# Opt level: O0

int main(int param_1,char **param_2)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  FILE *__stream;
  FILE *in_RCX;
  size_t n;
  size_t n_00;
  size_t n_01;
  size_t n_02;
  code *pcVar4;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  void *local_1b8;
  size_t len;
  undefined1 local_1a8 [7];
  bool done;
  uchar buf [50];
  FILE *f;
  undefined1 local_158 [4];
  int i;
  Pl_MD5 p2;
  Pl_MD5 p;
  Pl_Discard d;
  undefined1 local_68 [8];
  MD5 b;
  undefined1 local_28 [8];
  MD5 a;
  char **param_1_local;
  int param_0_local;
  
  a.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)param_2;
  test_string("");
  test_string("a");
  test_string("abc");
  test_string("message digest");
  test_string("abcdefghijklmnopqrstuvwxyz");
  test_string("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789");
  test_string("12345678901234567890123456789012345678901234567890123456789012345678901234567890");
  MD5::MD5((MD5 *)local_28,(uchar *)param_2,n,(uchar *)in_RCX);
  MD5::encodeFile((MD5 *)local_28,"md5.in",-1);
  MD5::unparse_abi_cxx11_
            ((string *)
             &b.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MD5 *)local_28);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           (string *)
                           &b.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  pcVar4 = std::endl<char,std::char_traits<char>>;
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string
            ((string *)
             &b.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  MD5::MD5((MD5 *)local_68,(uchar *)pcVar4,n_00,(uchar *)in_RCX);
  MD5::encodeFile((MD5 *)local_68,"md5.in",100);
  MD5::unparse_abi_cxx11_((string *)&d.super_Pipeline.next_,(MD5 *)local_68);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&d.super_Pipeline.next_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&d.super_Pipeline.next_);
  bVar1 = MD5::checkDataChecksum
                    ((MD5 *)"900150983cd24fb0d6963f7d28e17f72","abc",(char *)0x3,(size_t)in_RCX);
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,bVar1);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  bVar1 = MD5::checkFileChecksum
                    ((MD5 *)"5f4b4321873433daae578f85c72f9e74","md5.in",(char *)0xffffffffffffffff,
                     (qpdf_offset_t)in_RCX);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,bVar1);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  bVar1 = MD5::checkFileChecksum
                    ((MD5 *)"6f4b4321873433daae578f85c72f9e74","md5.in",(char *)0xffffffffffffffff,
                     (qpdf_offset_t)in_RCX);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,bVar1);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  bVar1 = MD5::checkDataChecksum
                    ((MD5 *)"000150983cd24fb0d6963f7d28e17f72","abc",(char *)0x3,(size_t)in_RCX);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,bVar1);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  bVar1 = MD5::checkFileChecksum
                    ((MD5 *)"6f4b4321873433daae578f85c72f9e74","glerbl",(char *)0xffffffffffffffff,
                     (qpdf_offset_t)in_RCX);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,bVar1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  Pl_Discard::Pl_Discard((Pl_Discard *)&p.enabled);
  Pl_MD5::Pl_MD5((Pl_MD5 *)&p2.enabled,"MD5",(Pipeline *)&p.enabled);
  Pl_MD5::Pl_MD5((Pl_MD5 *)local_158,"MD5",(Pipeline *)&p.enabled);
  Pl_MD5::persistAcrossFinish((Pl_MD5 *)local_158,true);
  for (f._4_4_ = 0; f._4_4_ < 2; f._4_4_ = f._4_4_ + 1) {
    __stream = (FILE *)QUtil::safe_fopen("md5.in","rb");
    len._7_1_ = 0;
    while (((len._7_1_ ^ 0xff) & 1) != 0) {
      in_RCX = __stream;
      local_1b8 = (void *)fread(local_1a8,1,0x32,__stream);
      if (local_1b8 == (void *)0x0) {
        len._7_1_ = 1;
      }
      else {
        Pl_MD5::write((Pl_MD5 *)&p2.enabled,(int)local_1a8,local_1b8,(size_t)in_RCX);
        Pl_MD5::write((Pl_MD5 *)local_158,(int)local_1a8,local_1b8,(size_t)in_RCX);
        if (f._4_4_ == 1) {
          Pl_MD5::getHexDigest_abi_cxx11_(&local_1d8,(Pl_MD5 *)&p2.enabled);
          poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_1d8);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_1d8);
        }
      }
    }
    fclose(__stream);
    Pl_MD5::finish((Pl_MD5 *)&p2.enabled);
    Pl_MD5::finish((Pl_MD5 *)local_158);
    Pl_MD5::getHexDigest_abi_cxx11_(&local_1f8,(Pl_MD5 *)&p2.enabled);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_1f8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_1f8);
    Pl_MD5::getHexDigest_abi_cxx11_(&local_218,(Pl_MD5 *)&p2.enabled);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_218);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_218);
  }
  Pl_MD5::getHexDigest_abi_cxx11_(&local_238,(Pl_MD5 *)local_158);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_238);
  pcVar4 = std::endl<char,std::char_traits<char>>;
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_238);
  Pl_MD5::~Pl_MD5((Pl_MD5 *)local_158);
  Pl_MD5::~Pl_MD5((Pl_MD5 *)&p2.enabled);
  Pl_Discard::~Pl_Discard((Pl_Discard *)&p.enabled);
  MD5::~MD5((MD5 *)local_68,(uchar *)pcVar4,n_01,(uchar *)in_RCX);
  MD5::~MD5((MD5 *)local_28,(uchar *)pcVar4,n_02,(uchar *)in_RCX);
  return 0;
}

Assistant:

int
main(int, char*[])
{
    test_string("");
    test_string("a");
    test_string("abc");
    test_string("message digest");
    test_string("abcdefghijklmnopqrstuvwxyz");
    test_string(
        "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghi"
        "jklmnopqrstuvwxyz0123456789");
    test_string(
        "1234567890123456789012345678901234567890"
        "1234567890123456789012345678901234567890");
    MD5 a;
    a.encodeFile("md5.in");
    std::cout << a.unparse() << std::endl;
    MD5 b;
    b.encodeFile("md5.in", 100);
    std::cout << b.unparse() << std::endl;

    std::cout << MD5::checkDataChecksum("900150983cd24fb0d6963f7d28e17f72", "abc", 3) << std::endl
              << MD5::checkFileChecksum("5f4b4321873433daae578f85c72f9e74", "md5.in") << std::endl
              << MD5::checkFileChecksum("6f4b4321873433daae578f85c72f9e74", "md5.in") << std::endl
              << MD5::checkDataChecksum("000150983cd24fb0d6963f7d28e17f72", "abc", 3) << std::endl
              << MD5::checkFileChecksum("6f4b4321873433daae578f85c72f9e74", "glerbl") << std::endl;

    Pl_Discard d;
    Pl_MD5 p("MD5", &d);
    // Create a second pipeline, protect against finish, and call
    // getHexDigest only once at the end of both passes. Make sure the
    // checksum is that of the input file concatenated to itself. This
    // will require changes to Pl_MD5.cc to prevent finish from
    // calling finalize.
    Pl_MD5 p2("MD5", &d);
    p2.persistAcrossFinish(true);
    for (int i = 0; i < 2; ++i) {
        FILE* f = QUtil::safe_fopen("md5.in", "rb");
        // buffer size < size of md5.in
        unsigned char buf[50];
        bool done = false;
        while (!done) {
            size_t len = fread(buf, 1, sizeof(buf), f);
            if (len <= 0) {
                done = true;
            } else {
                p.write(buf, len);
                p2.write(buf, len);
                if (i == 1) {
                    // Partial digest -- resets after each call to write
                    std::cout << p.getHexDigest() << std::endl;
                }
            }
        }
        fclose(f);
        p.finish();
        p2.finish();
        // Make sure calling getHexDigest twice with no intervening
        // writes results in the same result each time.
        std::cout << p.getHexDigest() << std::endl;
        std::cout << p.getHexDigest() << std::endl;
    }
    std::cout << p2.getHexDigest() << std::endl;

    return 0;
}